

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

ostream * mjs::operator<<(ostream *os,token *t)

{
  ostream *poVar1;
  __string_type s;
  wostringstream oss;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  long local_1b0;
  long local_1a8;
  wostringstream local_190 [376];
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  operator<<((wostream *)local_190,t);
  std::__cxx11::wstringbuf::str();
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            ((string *)local_1d0,local_1b0,local_1b0 + local_1a8 * 4);
  poVar1 = std::operator<<(os,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::wstring::~wstring((wstring *)&local_1b0);
  std::__cxx11::wostringstream::~wostringstream(local_190);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const token& t) {
    std::wostringstream oss;
    oss << t;
    auto s = oss.str();
    return os << std::string{s.begin(),s.end()};
}